

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

QPDFObjectHandle __thiscall QPDFObjectHandle::copyStream(QPDFObjectHandle *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  reference key;
  bool bVar1;
  QPDF *pQVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  QPDFObjectHandle *in_RSI;
  QPDFObjectHandle QVar4;
  QPDFObjectHandle local_110;
  reference local_100;
  T *iter;
  iterator __end1;
  iterator __begin1;
  QPDFDictItems *__range1;
  QPDFObjectHandle old_dict;
  undefined1 local_30 [8];
  QPDFObjectHandle dict;
  QPDFObjectHandle *this_local;
  QPDFObjectHandle *result;
  
  assertStream(in_RSI);
  dict.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._7_1_ = 0;
  pQVar2 = getOwningQPDF(in_RSI);
  newStream(this,pQVar2);
  getDict((QPDFObjectHandle *)local_30);
  getDict((QPDFObjectHandle *)&__range1);
  QPDFDictItems::QPDFDictItems
            ((QPDFDictItems *)
             &__begin1.ivalue.second.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (QPDFObjectHandle *)&__range1);
  this_00 = &__begin1.ivalue.second.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  QPDFDictItems::begin
            ((iterator *)
             &__end1.ivalue.second.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (QPDFDictItems *)this_00);
  QPDFDictItems::end((iterator *)&iter,(QPDFDictItems *)this_00);
  while( true ) {
    bVar1 = QPDFDictItems::iterator::operator!=
                      ((iterator *)
                       &__end1.ivalue.second.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                       (iterator *)&iter);
    if (!bVar1) break;
    local_100 = QPDFDictItems::iterator::operator*[abi_cxx11_
                          ((iterator *)
                           &__end1.ivalue.second.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    bVar1 = isIndirect(&local_100->second);
    key = local_100;
    if (bVar1) {
      replaceKey((QPDFObjectHandle *)local_30,&local_100->first,&local_100->second);
    }
    else {
      shallowCopy(&local_110);
      replaceKey((QPDFObjectHandle *)local_30,&key->first,&local_110);
      ~QPDFObjectHandle(&local_110);
    }
    QPDFDictItems::iterator::operator++
              ((iterator *)
               &__end1.ivalue.second.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  QPDFDictItems::iterator::~iterator((iterator *)&iter);
  QPDFDictItems::iterator::~iterator
            ((iterator *)
             &__end1.ivalue.second.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFDictItems::~QPDFDictItems
            ((QPDFDictItems *)
             &__begin1.ivalue.second.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  pQVar2 = getOwningQPDF(in_RSI);
  QPDF::StreamCopier::copyStreamData(pQVar2,this,in_RSI);
  dict.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._7_1_ = 1;
  ~QPDFObjectHandle((QPDFObjectHandle *)&__range1);
  ~QPDFObjectHandle((QPDFObjectHandle *)local_30);
  _Var3._M_pi = extraout_RDX;
  if ((dict.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi._7_1_ & 1) == 0) {
    ~QPDFObjectHandle(this);
    _Var3._M_pi = extraout_RDX_00;
  }
  QVar4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var3._M_pi;
  QVar4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFObjectHandle::copyStream()
{
    assertStream();
    QPDFObjectHandle result = newStream(this->getOwningQPDF());
    QPDFObjectHandle dict = result.getDict();
    QPDFObjectHandle old_dict = getDict();
    for (auto& iter: QPDFDictItems(old_dict)) {
        if (iter.second.isIndirect()) {
            dict.replaceKey(iter.first, iter.second);
        } else {
            dict.replaceKey(iter.first, iter.second.shallowCopy());
        }
    }
    QPDF::StreamCopier::copyStreamData(getOwningQPDF(), result, *this);
    return result;
}